

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_StoPrintOne(Nf_Man_t *p,int Count,int t,int i,int GateId,Nf_Cfg_t Mat)

{
  int iVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  word *pwVar4;
  ulong uVar5;
  int v;
  long lVar6;
  int SuppSize;
  int nVarsInit;
  undefined4 in_register_00000034;
  char *__format;
  word *pwVar7;
  uint uVar8;
  Mio_Cell2_t *pMVar9;
  byte bVar10;
  
  if ((-1 < t) && (pVVar3 = p->vTtMem, t < pVVar3->nEntries)) {
    pMVar9 = p->pCells + GateId;
    pwVar4 = pVVar3->ppPages[(uint)t >> ((byte)pVVar3->LogPageSze & 0x1f)];
    iVar1 = pVVar3->nEntrySize;
    uVar2 = pVVar3->PageMask;
    uVar5 = pwVar4[(long)(int)(uVar2 & t) * (long)iVar1];
    lVar6 = 0;
    pwVar7 = s_Truths6Neg;
    nVarsInit = 0;
    do {
      nVarsInit = (nVarsInit + 1) -
                  (uint)(((uVar5 >> ((byte)(1 << ((byte)lVar6 & 0x1f)) & 0x3f) ^ uVar5) & *pwVar7)
                        == 0);
      lVar6 = lVar6 + 1;
      pwVar7 = pwVar7 + 1;
    } while (lVar6 != 6);
    bVar10 = 0;
    printf("%6d : ",CONCAT44(in_register_00000034,Count));
    printf("%6d : ",(ulong)(uint)t);
    printf("%6d : ",(ulong)(uint)i);
    printf("Gate %16s  ",pMVar9->pName);
    printf("Area =%8.2f  ",(double)pMVar9->AreaF);
    printf("In = %d   ",(ulong)(*(uint *)&pMVar9->field_0x10 >> 0x1c));
    __format = " compl ";
    if (((uint)Mat & 1) == 0) {
      __format = "       ";
    }
    printf(__format);
    if (0xfffffff < *(uint *)&pMVar9->field_0x10) {
      uVar8 = 0;
      do {
        putchar((((uint)Mat >> 8) >> (bVar10 & 0x1f) & 7) +
                (((uint)Mat >> 1 & 0x7f) >> ((byte)uVar8 & 0x1f) & 1) * -0x20 + 0x61);
        uVar8 = uVar8 + 1;
        bVar10 = bVar10 + 3;
      } while (uVar8 < *(uint *)&pMVar9->field_0x10 >> 0x1c);
    }
    printf("  ");
    Dau_DsdPrintFromTruth(pwVar4 + (long)(int)(uVar2 & t) * (long)iVar1,nVarsInit);
    return;
  }
  __assert_fail("i >= 0 && i < p->nEntries",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
}

Assistant:

void Nf_StoPrintOne( Nf_Man_t * p, int Count, int t, int i, int GateId, Nf_Cfg_t Mat )
{
    Mio_Cell2_t * pC = p->pCells + GateId;
    word * pTruth = Vec_MemReadEntry(p->vTtMem, t);
    int k, nSuppSize = Abc_TtSupportSize(pTruth, 6);
    printf( "%6d : ", Count );
    printf( "%6d : ", t );
    printf( "%6d : ", i );
    printf( "Gate %16s  ",   pC->pName );
    printf( "Area =%8.2f  ", pC->AreaF );
    printf( "In = %d   ",    pC->nFanins );
    if ( Mat.fCompl )
        printf( " compl " );
    else
        printf( "       " );
    for ( k = 0; k < (int)pC->nFanins; k++ )
    {
        int fComplF = (Mat.Phase >> k) & 1;
        int iFanin  = (Mat.Perm >> (3*k)) & 7;
        printf( "%c", 'a' + iFanin - fComplF * ('a' - 'A') );
    }
    printf( "  " );
    Dau_DsdPrintFromTruth( pTruth, nSuppSize );
}